

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::CommandDiagReset
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aAddr,uint64_t aDiagDataFlags
          )

{
  element_type *peVar1;
  Error local_58;
  undefined1 local_29;
  uint64_t local_28;
  uint64_t aDiagDataFlags_local;
  string *aAddr_local;
  CommissionerApp *this_local;
  Error *error;
  
  local_29 = 0;
  local_28 = aDiagDataFlags;
  aDiagDataFlags_local = (uint64_t)aAddr;
  aAddr_local = (string *)this;
  this_local = (CommissionerApp *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  peVar1 = std::
           __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mCommissioner);
  (*peVar1->_vptr_Commissioner[0x39])(&local_58,peVar1,aDiagDataFlags_local,local_28);
  Error::operator=(__return_storage_ptr__,&local_58);
  Error::~Error(&local_58);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::CommandDiagReset(const std::string &aAddr, uint64_t aDiagDataFlags)
{
    Error error;

    error = mCommissioner->CommandDiagReset(aAddr, aDiagDataFlags);
    return error;
}